

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void absl::lts_20250127::crc_internal::CRC32::ExtendByZeroesImpl
               (uint32_t *crc,size_t length,uint32_t *zeroes_table,uint32_t *poly_table)

{
  int local_74;
  ulong uStack_70;
  int x;
  uint64_t result;
  uint64_t mtab [4];
  uint64_t m2;
  uint64_t m;
  int local_30;
  int c;
  int i;
  uint32_t l;
  uint32_t *poly_table_local;
  uint32_t *zeroes_table_local;
  size_t length_local;
  uint32_t *crc_local;
  
  if (length != 0) {
    c = *crc;
    local_30 = 0;
    for (zeroes_table_local = (uint32_t *)length; zeroes_table_local != (uint32_t *)0x0;
        zeroes_table_local = (uint32_t *)((ulong)zeroes_table_local >> 4)) {
      if (((ulong)zeroes_table_local & 0xf) != 0) {
        mtab[0] = (ulong)zeroes_table[(int)(((uint)zeroes_table_local & 0xf) + local_30 + -1)] << 1;
        mtab[3] = (ulong)zeroes_table[(int)(((uint)zeroes_table_local & 0xf) + local_30 + -1)] << 2;
        mtab[1] = mtab[3];
        mtab[2] = mtab[3] ^ mtab[0];
        uStack_70 = 0;
        for (local_74 = 0; local_74 < 0x20; local_74 = local_74 + 8) {
          uStack_70 = mtab[(ulong)(c & 3) - 1] ^ mtab[(ulong)((uint)c >> 2 & 3) - 1] << 2 ^
                      mtab[(ulong)((uint)c >> 4 & 3) - 1] << 4 ^
                      mtab[(ulong)((uint)c >> 6 & 3) - 1] << 6 ^ uStack_70;
          c = (uint)c >> 8;
          uStack_70 = uStack_70 >> 8 ^ (ulong)poly_table[uStack_70 & 0xff];
        }
        c = (int)uStack_70;
      }
      local_30 = local_30 + 0xf;
    }
    *crc = c;
  }
  return;
}

Assistant:

void CRC32::ExtendByZeroesImpl(uint32_t* crc, size_t length,
                               const uint32_t zeroes_table[256],
                               const uint32_t poly_table[256]) {
  if (length != 0) {
    uint32_t l = *crc;
    // For each ZEROES_BASE_LG bits in length
    // (after the low-order bits have been removed)
    // we lookup the appropriate polynomial in the zeroes_ array
    // and do a polynomial long multiplication (mod the CRC polynomial)
    // to extend the CRC by the appropriate number of bits.
    for (int i = 0; length != 0;
         i += ZEROES_BASE - 1, length >>= ZEROES_BASE_LG) {
      int c = length & (ZEROES_BASE - 1);  // pick next ZEROES_BASE_LG bits
      if (c != 0) {                        // if they are not zero,
                                           // multiply by entry in table
        // Build a table to aid in multiplying 2 bits at a time.
        // It takes too long to build tables for more bits.
        uint64_t m = zeroes_table[c + i - 1];
        m <<= 1;
        uint64_t m2 = m << 1;
        uint64_t mtab[4] = {0, m, m2, m2 ^ m};

        // Do the multiply one byte at a time.
        uint64_t result = 0;
        for (int x = 0; x < 32; x += 8) {
          // The carry-less multiply.
          result ^= mtab[l & 3] ^ (mtab[(l >> 2) & 3] << 2) ^
                    (mtab[(l >> 4) & 3] << 4) ^ (mtab[(l >> 6) & 3] << 6);
          l >>= 8;

          // Reduce modulo the polynomial
          result = (result >> 8) ^ poly_table[result & 0xff];
        }
        l = static_cast<uint32_t>(result);
      }
    }
    *crc = l;
  }
}